

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_punpckhbh_mips(uint64_t fs,uint64_t ft)

{
  return fs >> 0x20 & 0xff |
         fs >> 0x10 & 0xff00000000 | fs >> 8 & 0xff000000000000 | ft & 0xff00000000000000 |
         (ulong)((uint)(fs >> 0x18) & 0xff0000) | ft >> 8 & 0xff0000000000 |
         (ulong)((uint)(ft >> 0x10) & 0xff000000) | (ulong)((uint)(ft >> 0x18) & 0xff00);
}

Assistant:

uint64_t helper_punpckhbh(uint64_t fs, uint64_t ft)
{
    unsigned host = BYTE_ORDER_XOR(7);
    LMIValue vd, vs, vt;

    vs.d = fs;
    vt.d = ft;
    vd.ub[0 ^ host] = vs.ub[4 ^ host];
    vd.ub[1 ^ host] = vt.ub[4 ^ host];
    vd.ub[2 ^ host] = vs.ub[5 ^ host];
    vd.ub[3 ^ host] = vt.ub[5 ^ host];
    vd.ub[4 ^ host] = vs.ub[6 ^ host];
    vd.ub[5 ^ host] = vt.ub[6 ^ host];
    vd.ub[6 ^ host] = vs.ub[7 ^ host];
    vd.ub[7 ^ host] = vt.ub[7 ^ host];

    return vd.d;
}